

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c++
# Opt level: O1

Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_> __thiscall
kj::TimerImpl::nextEvent(TimerImpl *this)

{
  Impl *pIVar1;
  _Base_ptr p_Var2;
  undefined8 *puVar3;
  undefined1 *in_RDI;
  Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_> MVar4;
  Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_> MVar5;
  
  pIVar1 = (this->impl).ptr;
  p_Var2 = (pIVar1->timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  MVar4.ptr.field_1 = &(pIVar1->timers)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != MVar4.ptr.field_1) {
    puVar3 = *(undefined8 **)(p_Var2 + 1);
    *in_RDI = 1;
    *(undefined8 *)(in_RDI + 8) = *puVar3;
    MVar4.ptr._0_8_ = in_RDI;
    return (Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_>)
           MVar4.ptr;
  }
  *in_RDI = 0;
  MVar5.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_>_2
        )MVar4.ptr.field_1;
  MVar5.ptr._0_8_ = in_RDI;
  return (Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_>)
         MVar5.ptr;
}

Assistant:

Maybe<TimePoint> TimerImpl::nextEvent() {
  auto iter = impl->timers.begin();
  if (iter == impl->timers.end()) {
    return kj::none;
  } else {
    return (*iter)->time;
  }
}